

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV AsymSignFinal(Session *session,CK_BYTE_PTR pSignature,CK_ULONG_PTR pulSignatureLen)

{
  bool bVar1;
  int iVar2;
  AsymmetricAlgorithm *pAVar3;
  PrivateKey *pPVar4;
  ulong __n;
  size_t sVar5;
  uchar *__src;
  CK_RV CVar6;
  ByteString signature;
  ByteString local_58;
  
  pAVar3 = Session::getAsymmetricCryptoOp(session);
  pPVar4 = Session::getPrivateKey(session);
  if (pAVar3 == (AsymmetricAlgorithm *)0x0 || pPVar4 == (PrivateKey *)0x0) {
    Session::resetOp(session);
    return 0x91;
  }
  bVar1 = Session::getReAuthentication(session);
  if (bVar1) {
    Session::resetOp(session);
    return 0x101;
  }
  __n = (**(code **)(*(long *)pPVar4 + 0x28))(pPVar4);
  if (pSignature == (CK_BYTE_PTR)0x0) {
    *pulSignatureLen = __n;
    return 0;
  }
  if (*pulSignatureLen < __n) {
    *pulSignatureLen = __n;
    return 0x150;
  }
  ByteString::ByteString(&local_58);
  iVar2 = (*pAVar3->_vptr_AsymmetricAlgorithm[5])(pAVar3,&local_58);
  if ((char)iVar2 != '\0') {
    sVar5 = ByteString::size(&local_58);
    if (sVar5 == __n) {
      __src = ByteString::byte_str(&local_58);
      memcpy(pSignature,__src,__n);
      *pulSignatureLen = __n;
      Session::resetOp(session);
      CVar6 = 0;
      goto LAB_0013604d;
    }
    softHSMLog(3,"AsymSignFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x12f2,"The size of the signature differs from the size of the mechanism");
  }
  CVar6 = 5;
  Session::resetOp(session);
LAB_0013604d:
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return CVar6;
}

Assistant:

static CK_RV AsymSignFinal(Session* session, CK_BYTE_PTR pSignature, CK_ULONG_PTR pulSignatureLen)
{
	AsymmetricAlgorithm* asymCrypto = session->getAsymmetricCryptoOp();
	PrivateKey* privateKey = session->getPrivateKey();
	if (asymCrypto == NULL || privateKey == NULL)
	{
		session->resetOp();
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	// Check if re-authentication is required
	if (session->getReAuthentication())
	{
		session->resetOp();
		return CKR_USER_NOT_LOGGED_IN;
	}

	// Size of the signature
	CK_ULONG size = privateKey->getOutputLength();
	if (pSignature == NULL_PTR)
	{
		*pulSignatureLen = size;
		return CKR_OK;
	}

	// Check buffer size
	if (*pulSignatureLen < size)
	{
		*pulSignatureLen = size;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the signature
	ByteString signature;
	if (!asymCrypto->signFinal(signature))
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Check size
	if (signature.size() != size)
	{
		ERROR_MSG("The size of the signature differs from the size of the mechanism");
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}
	memcpy(pSignature, signature.byte_str(), size);
	*pulSignatureLen = size;

	session->resetOp();
	return CKR_OK;
}